

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O3

double * append_coord_dofs_face
                   (int order,double *dest,double *verts,int *edges,int *faces,int nfaces,
                   double travel,int component)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (0 < nfaces && 1 < order) {
    uVar10 = 0;
    lVar11 = (long)component;
    do {
      iVar5 = edges[(long)faces[uVar10 * 4 + 2] * 2 + 1];
      iVar6 = edges[faces[uVar10 * 4 + 2] * 2];
      iVar7 = edges[(long)faces[uVar10 * 4] * 2];
      iVar8 = edges[faces[uVar10 * 4] * 2 + 1];
      iVar9 = 1;
      dVar13 = 1.0;
      do {
        dVar14 = dVar13 / (double)order;
        dVar17 = 1.0;
        iVar12 = 1;
        do {
          dVar15 = dVar17 / (double)order;
          dVar1 = verts[(long)iVar7 * 3 + lVar11];
          dVar2 = verts[(long)iVar8 * 3 + lVar11];
          dVar3 = verts[(long)iVar6 * 3 + lVar11];
          dVar4 = verts[(long)iVar5 * 3 + lVar11];
          dVar16 = drand48();
          dVar16 = cos((dVar16 + dVar16) * 3.141592653589793);
          *dest = dVar16 * travel +
                  (1.0 - dVar15) * dVar14 * dVar4 +
                  dVar15 * dVar14 * dVar3 +
                  (1.0 - dVar14) * (1.0 - dVar15) * dVar2 + (1.0 - dVar14) * dVar15 * dVar1;
          dest = dest + 1;
          dVar17 = dVar17 + 1.0;
          iVar12 = iVar12 + 1;
        } while (order != iVar12);
        dVar13 = dVar13 + 1.0;
        iVar9 = iVar9 + 1;
      } while (iVar9 != order);
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)nfaces);
  }
  return dest;
}

Assistant:

double *
append_coord_dofs_face(int order, double *dest, const double *verts,
                       const int *edges, const int *faces, int nfaces, double travel,
                       int component) {
  int i,ii,jj,e0,e2,v0,v1,v2,v3;
  double value, r,s, *ptr = dest;
  if(order >= 2) {
    for(i = 0; i < nfaces; ++i) {
      /* NOTE: we assume edges point the same way. */
      e0 = faces[i*4+0];
      e2 = faces[i*4+2];

      /* 3012 seems to be the ordering to get interior dofs
         in the right order. */
      v0 = edges[e0*2+1];
      v1 = edges[e0*2+0];
      v2 = edges[e2*2+0];
      v3 = edges[e2*2+1];

      /* Make interior points by blending the quad vertices */
      for(jj = 1; jj < order; ++jj)
        for(ii = 1; ii < order; ++ii) {
          r = ((double)ii)/((double)order);
          s = ((double)jj)/((double)order);

          value = (1.-r)*(1.-s)*verts[v0*3+component] +
                  r     *(1.-s)*verts[v1*3+component] +
                  r     *s     *verts[v2*3+component] +
                  (1.-r)*s     *verts[v3*3+component];

          /* Perturb the point */
          value += travel * cos(drand48() * 2 * M_PI);

          *ptr++ = value;
        }
    }
  }
  return ptr;
}